

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

const_iterator * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::upper_bound(const_iterator *__return_storage_ptr__,
             btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
             *this,key_type *key)

{
  unsigned_short uVar1;
  int iVar2;
  inner_node *inner;
  leaf_node *n;
  
  n = (leaf_node *)this->m_root;
  if (n == (leaf_node *)0x0) {
    n = this->m_tailleaf;
    if (n == (leaf_node *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (n->super_node).slotuse;
    }
  }
  else {
    for (; (n->super_node).level != 0; n = (leaf_node *)n->slotkey[(long)iVar2 + 0xe]) {
      iVar2 = btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
              ::
              find_upper<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::inner_node>
                        (this,(inner_node *)n,key);
    }
    iVar2 = btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
            ::
            find_upper<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
                      (this,n,key);
    uVar1 = (unsigned_short)iVar2;
  }
  __return_storage_ptr__->currnode = n;
  __return_storage_ptr__->currslot = uVar1;
  (__return_storage_ptr__->temp_value).first = 0.0;
  (__return_storage_ptr__->temp_value).second = (BufferNode<double,_long> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator upper_bound(const key_type& key) const
        {
            const node *n = m_root;
            if (!n) return end();

            while(!n->isleafnode())
            {
                const inner_node *inner = static_cast<const inner_node*>(n);
                int slot = find_upper(inner, key);

                n = inner->childid[slot];
            }

            const leaf_node *leaf = static_cast<const leaf_node*>(n);

            int slot = find_upper(leaf, key);
            return const_iterator(leaf, slot);
        }